

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  MessageOptions *pMVar1;
  FileOptions *pFVar2;
  FileDescriptor *pFVar3;
  ushort *puVar4;
  ExtensionRangeOptions *pEVar5;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view declared_type_name;
  FieldDescriptor *pFVar6;
  code *pcVar7;
  int iVar8;
  Descriptor *pDVar9;
  void *pvVar10;
  ExtensionRange *pEVar11;
  Rep *pRVar12;
  void **ppvVar13;
  undefined8 *puVar14;
  Nonnull<const_char_*> pcVar15;
  bool bVar16;
  char *pcVar17;
  byte bVar18;
  ulong uVar19;
  _anonymous_namespace_ *this_00;
  undefined8 *puVar20;
  ErrorLocation location;
  char *error;
  DescriptorBuilder *this_01;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *pRVar21;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *this_02;
  size_type __rlen;
  Tables *__n;
  DescriptorBuilder *__s;
  undefined4 uVar22;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  string_view message_name;
  string_view element_name_07;
  string_view declared_full_name;
  string_view input;
  FieldDescriptor *local_98;
  ulong local_90;
  FieldDescriptor **local_88;
  undefined1 local_80 [40];
  code *pcStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  code *pcStack_38;
  
  local_98 = field;
  if (this->pool_->lazily_build_dependencies_ == true) {
    if (field == (FieldDescriptor *)0x0) {
      return;
    }
    pDVar9 = FieldDescriptor::message_type(field);
    if (pDVar9 == (Descriptor *)0x0) {
      return;
    }
  }
  ValidateFieldFeatures(this,local_98,proto);
  if ((1000 < (int)local_98->file_->edition_) && ((~local_98->field_0x3 & 6) != 0)) {
    pcVar17 = (local_98->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar17 + 2);
    element_name._M_str = pcVar17 + ~element_name._M_len;
    AddError(this,element_name,&proto->super_Message,TYPE,
             "ctype option is not allowed under edition 2024 and beyond. Use the feature string_type = VIEW|CORD|STRING|... instead."
            );
  }
  if ((((local_98->options_->field_0)._impl_.lazy_ != false) ||
      ((local_98->options_->field_0)._impl_.unverified_lazy_ == true)) && (local_98->type_ != '\v'))
  {
    pcVar17 = (local_98->all_names_).payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar17 + 2);
    element_name_00._M_str = pcVar17 + ~element_name_00._M_len;
    AddError(this,element_name_00,&proto->super_Message,TYPE,
             "[lazy = true] can only be specified for submessage fields.");
  }
  pFVar6 = local_98;
  if ((local_98->options_->field_0)._impl_.packed_ == true) {
    bVar18 = local_98->field_0x1;
    bVar16 = (bool)((bVar18 & 0x20) >> 5);
    if (0xbf < bVar18 == bVar16) {
      pcVar15 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar16,0xbf < bVar18,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar15 != (Nonnull<const_char_*>)0x0) {
      ValidateOptions();
      goto LAB_00225020;
    }
    if (((pFVar6->field_0x1 & 0x20) == 0) || (0xfffffffb < pFVar6->type_ - 0xd)) {
      pcVar17 = (local_98->all_names_).payload_;
      element_name_01._M_len = (ulong)*(ushort *)(pcVar17 + 2);
      element_name_01._M_str = pcVar17 + ~element_name_01._M_len;
      AddError(this,element_name_01,&proto->super_Message,TYPE,
               "[packed = true] can only be specified for repeated primitive fields.");
    }
  }
  pFVar6 = local_98;
  if (((local_98->containing_type_ != (Descriptor *)0x0) &&
      (pMVar1 = local_98->containing_type_->options_,
      pMVar1 != (MessageOptions *)_MessageOptions_default_instance_)) &&
     ((pMVar1->field_0)._impl_.message_set_wire_format_ == true)) {
    bVar18 = local_98->field_0x1;
    if ((bVar18 & 8) == 0) {
      pcVar17 = (local_98->all_names_).payload_;
      uVar19 = (ulong)*(ushort *)(pcVar17 + 2);
      pcVar17 = pcVar17 + ~uVar19;
      error = "MessageSets cannot have fields, only extensions.";
      location = NAME;
    }
    else {
      if ((local_98->merged_features_->field_0)._impl_.field_presence_ != 3) {
        bVar16 = (bool)((bVar18 & 0x20) >> 5);
        if (0xbf < bVar18 == bVar16) {
          pcVar15 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar16,0xbf < bVar18,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar15 != (Nonnull<const_char_*>)0x0) {
LAB_00225020:
          ValidateOptions();
        }
        if (((pFVar6->field_0x1 & 0x20) == 0) && (local_98->type_ == '\v')) goto LAB_00224c15;
      }
      pcVar17 = (local_98->all_names_).payload_;
      uVar19 = (ulong)*(ushort *)(pcVar17 + 2);
      pcVar17 = pcVar17 + ~uVar19;
      error = "Extensions of MessageSets must be optional messages.";
      location = TYPE;
    }
    element_name_02._M_str = pcVar17;
    element_name_02._M_len = uVar19;
    AddError(this,element_name_02,&proto->super_Message,location,error);
  }
LAB_00224c15:
  if (((((local_98->file_ != (FileDescriptor *)0x0) &&
        (pFVar2 = local_98->file_->options_, pFVar2 != (FileOptions *)_FileOptions_default_instance_
        )) && ((pFVar2->field_0)._impl_.optimize_for_ == 3)) &&
      (local_98->containing_type_ != (Descriptor *)0x0)) &&
     (((pFVar3 = local_98->containing_type_->file_, pFVar3 == (FileDescriptor *)0x0 ||
       (pFVar2 = pFVar3->options_, pFVar2 == (FileOptions *)_FileOptions_default_instance_)) ||
      ((pFVar2->field_0)._impl_.optimize_for_ != 3)))) {
    pcVar17 = (local_98->all_names_).payload_;
    element_name_03._M_len = (ulong)*(ushort *)(pcVar17 + 2);
    element_name_03._M_str = pcVar17 + ~element_name_03._M_len;
    AddError(this,element_name_03,&proto->super_Message,EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
            );
  }
  if (((local_98->type_ == '\v') &&
      (pDVar9 = FieldDescriptor::message_type(local_98),
      (pDVar9->options_->field_0)._impl_.map_entry_ == true)) &&
     (bVar16 = ValidateMapEntry(this,local_98,proto), !bVar16)) {
    pcVar17 = (local_98->all_names_).payload_;
    element_name_04._M_len = (ulong)*(ushort *)(pcVar17 + 2);
    element_name_04._M_str = pcVar17 + ~element_name_04._M_len;
    AddError(this,element_name_04,&proto->super_Message,TYPE,
             "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
  }
  this_01 = this;
  ValidateJSType(this,local_98,proto);
  bVar18 = local_98->field_0x1 & 0xc;
  if (bVar18 == 0xc) {
    pcVar17 = (local_98->all_names_).payload_;
    local_90 = (ulong)*(ushort *)(pcVar17 + 0xc);
    __n = (Tables *)(ulong)*(ushort *)(pcVar17 + 0xe);
    puVar4 = (ushort *)(local_98->all_names_).payload_;
    this_00 = (_anonymous_namespace_ *)(ulong)*puVar4;
    input._M_len = (long)puVar4 + ~(ulong)this_00;
    this_01 = (DescriptorBuilder *)local_80;
    input._M_str._0_2_ = *(ushort *)(pcVar17 + 0xc);
    input._M_str._2_6_ = 0;
    protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_((string *)this_01,this_00,input);
    bVar16 = true;
    if ((Tables *)local_80._8_8_ != __n) goto LAB_00224d6e;
    if (__n != (Tables *)0x0) {
      this_01 = (DescriptorBuilder *)(pcVar17 + -local_90);
      iVar8 = bcmp(this_01,(void *)local_80._0_8_,(size_t)__n);
      bVar16 = iVar8 != 0;
      goto LAB_00224d6e;
    }
  }
  bVar16 = false;
LAB_00224d6e:
  if ((bVar18 == 0xc) &&
     (this_01 = (DescriptorBuilder *)local_80._0_8_,
     (DescriptorBuilder *)local_80._0_8_ != (DescriptorBuilder *)(local_80 + 0x10))) {
    operator_delete((void *)local_80._0_8_,(ulong)((char *)local_80._16_8_ + 1));
    this_01 = (DescriptorBuilder *)local_80._0_8_;
  }
  if (bVar16) {
    pcVar17 = (local_98->all_names_).payload_;
    element_name_05._M_len = (ulong)*(ushort *)(pcVar17 + 2);
    element_name_05._M_str = pcVar17 + ~element_name_05._M_len;
    this_01 = this;
    AddError(this,element_name_05,&proto->super_Message,OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }
  pcVar17 = (local_98->all_names_).payload_;
  if ((ulong)*(ushort *)(pcVar17 + 0xe) != 0) {
    __s = (DescriptorBuilder *)(pcVar17 + -(ulong)*(ushort *)(pcVar17 + 0xc));
    this_01 = __s;
    pvVar10 = memchr(__s,0,(ulong)*(ushort *)(pcVar17 + 0xe));
    if ((long)pvVar10 - (long)__s != -1 && pvVar10 != (void *)0x0) {
      element_name_06._M_len = (ulong)*(ushort *)(pcVar17 + 2);
      element_name_06._M_str = pcVar17 + ~element_name_06._M_len;
      this_01 = this;
      AddError(this,element_name_06,&proto->super_Message,OPTION_NAME,
               "json_name cannot have embedded null characters.");
    }
  }
  if (((local_98->field_0x1 & 8) != 0) &&
     (pcVar17 = (local_98->containing_type_->all_names_).payload_,
     message_name._M_len = (ulong)*(ushort *)(pcVar17 + 2),
     message_name._M_str = pcVar17 + ~message_name._M_len,
     bVar16 = DescriptorPool::IsReadyForCheckingDescriptorExtDecl
                        ((DescriptorPool *)this_01,message_name), !bVar16)) {
    pEVar11 = Descriptor::FindExtensionRangeContainingNumber
                        (local_98->containing_type_,local_98->number_);
    pEVar5 = pEVar11->options_;
    if ((pEVar5 != (ExtensionRangeOptions *)0x0) &&
       ((byte)(this->pool_->enforce_extension_declarations_ - kCustomExtensions) < 2)) {
      this_02 = &(pEVar5->field_0)._impl_.declaration_;
      pRVar21 = this_02;
      if ((*(byte *)((long)&pEVar5->field_0 + 0x20) & 1) != 0) {
        pRVar12 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
        pRVar21 = (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                  pRVar12->elements;
      }
      if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pRVar12 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
        this_02 = (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                  pRVar12->elements;
      }
      ppvVar13 = &(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                 *(int *)((long)&pEVar5->field_0 + 0x28);
      if (pRVar21 !=
          (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)ppvVar13) {
        do {
          pvVar10 = (pRVar21->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
          if (*(int *)((long)pvVar10 + 0x28) == local_98->number_) {
            if (*(char *)((long)pvVar10 + 0x2c) != '\x01') {
              puVar14 = (undefined8 *)(*(ulong *)((long)pvVar10 + 0x18) & 0xfffffffffffffffc);
              puVar20 = (undefined8 *)(*(ulong *)((long)pvVar10 + 0x20) & 0xfffffffffffffffc);
              uStack_48 = *puVar20;
              local_50 = puVar20[1];
              declared_type_name._M_str._0_4_ = (int)uStack_48;
              declared_type_name._M_len = local_50;
              declared_type_name._M_str._4_4_ = (int)((ulong)uStack_48 >> 0x20);
              declared_full_name._M_str = (char *)*puVar14;
              declared_full_name._M_len = puVar14[1];
              CheckExtensionDeclaration
                        (this,local_98,proto,declared_full_name,declared_type_name,
                         *(bool *)((long)pvVar10 + 0x2d));
              return;
            }
            pcVar17 = (local_98->all_names_).payload_;
            uVar19 = (ulong)*(ushort *)(pcVar17 + 2);
            pcVar17 = pcVar17 + ~uVar19;
            local_40 = &local_88;
            pcStack_38 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
            ;
            pcVar7 = pcStack_38;
            pcStack_38._0_4_ = 0x233e74;
            uVar22 = pcStack_38._0_4_;
            pcStack_38 = pcVar7;
            goto LAB_00224f69;
          }
          pRVar21 = (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                    &(pRVar21->super_RepeatedPtrFieldBase).current_size_;
        } while (pRVar21 !=
                 (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)ppvVar13);
      }
      if ((*(int *)((long)&pEVar11->options_->field_0 + 0x28) != 0) ||
         ((pEVar11->options_->field_0)._impl_.verification_ == 0)) {
        pcVar17 = (local_98->all_names_).payload_;
        uVar19 = (ulong)*(ushort *)(pcVar17 + 2);
        pcVar17 = pcVar17 + ~uVar19;
        local_80._32_8_ = &local_88;
        pcStack_58 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__1,std::__cxx11::string>
        ;
        pcVar7 = pcStack_58;
        pcStack_58._0_4_ = 0x233f3d;
        uVar22 = pcStack_58._0_4_;
        pcStack_58 = pcVar7;
LAB_00224f69:
        local_88 = &local_98;
        make_error.invoker_._0_4_ = uVar22;
        make_error.ptr_.obj = &local_88;
        make_error.invoker_._4_4_ = 0;
        element_name_07._M_str = pcVar17;
        element_name_07._M_len = uVar19;
        AddError(this,element_name_07,&proto->super_Message,EXTENDEE,make_error);
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const FieldDescriptor* field,
                                        const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }

  ValidateFieldFeatures(field, proto);

  if (field->file()->edition() >= Edition::EDITION_2024 &&
      field->has_legacy_proto_ctype()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "ctype option is not allowed under edition 2024 and beyond. Use "
             "the feature string_type = VIEW|CORD|STRING|... instead.");
  }

  // Only message type fields may be lazy.
  if (field->options().lazy() || field->options().unverified_lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if ((field->is_required() || field->is_repeated()) ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (calculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // a user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

  if (absl::StrContains(field->json_name(), '\0')) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "json_name cannot have embedded null characters.");
  }


  // If this is a declared extension, validate that the actual name and type
  // match the declaration.
  if (field->is_extension()) {
    if (pool_->IsReadyForCheckingDescriptorExtDecl(
            field->containing_type()->full_name())) {
      return;
    }
    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range->options_ == nullptr) {
      return;
    }

    if (pool_->EnforceCustomExtensionDeclarations()) {
      for (const auto& declaration : extension_range->options_->declaration()) {
        if (declaration.number() != field->number()) continue;
        if (declaration.reserved()) {
          AddError(
              field->full_name(), proto,
              DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                return absl::Substitute(
                    "Cannot use number $0 for extension field $1, as it is "
                    "reserved in the extension declarations for message $2.",
                    field->number(), field->full_name(),
                    field->containing_type()->full_name());
              });
          return;
        }
        CheckExtensionDeclaration(*field, proto, declaration.full_name(),
                                  declaration.type(), declaration.repeated());
        return;
      }

      // Either no declarations, or there are but no matches. If there are no
      // declarations, we check its verification state. If there are other
      // non-matching declarations, we enforce that this extension must also be
      // declared.
      if (!extension_range->options_->declaration().empty() ||
          (extension_range->options_->verification() ==
           ExtensionRangeOptions::DECLARATION)) {
        AddError(
            field->full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
            [&] {
              return absl::Substitute(
                  "Missing extension declaration for field $0 with number $1 "
                  "in extendee message $2. An extension range must declare for "
                  "all extension fields if its verification state is "
                  "DECLARATION or there's any declaration in the range "
                  "already. Otherwise, consider splitting up the range.",
                  field->full_name(), field->number(),
                  field->containing_type()->full_name());
            });
        return;
      }
    }
  }
}